

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

void __thiscall
wasm::
SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
::erase(SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
        *this,uint *x)

{
  if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase(&(this->flexible)._M_t,x);
    return;
  }
  OrderedFixedStorage<unsigned_int,_3UL>::erase(&this->fixed,x);
  return;
}

Assistant:

void erase(const T& x) {
    if (usingFixed()) {
      fixed.erase(x);
    } else {
      flexible.erase(x);
    }
  }